

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O3

int doBmpTest(char *ext,int width,int align,int height,int pf,int flags)

{
  bool bVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [16];
  undefined6 uVar11;
  unkbyte10 Var12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [14];
  short sVar15;
  undefined4 uVar16;
  uint height_00;
  int iVar17;
  int iVar18;
  uchar *puVar19;
  ulong uVar20;
  char *__s1;
  undefined8 uVar21;
  uchar *buf;
  char *pcVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  char *pcVar26;
  uchar uVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  double dVar32;
  int iVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  char cVar41;
  undefined1 uVar42;
  char cVar43;
  char cVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  double dVar48;
  int loadHeight;
  int loadWidth;
  int pixelFormat;
  char filename [80];
  char md5buf [65];
  int local_140;
  int local_13c;
  uint local_138;
  int local_134;
  size_t local_130;
  uint local_128;
  int local_124;
  ulong local_120;
  int local_118;
  uint local_114;
  char *local_110;
  char *local_108;
  uchar *local_100;
  ulong local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  char local_d8 [80];
  double local_88;
  undefined8 uStack_80;
  char local_78 [72];
  char cVar3;
  char cVar4;
  char cVar5;
  
  local_130 = (size_t)tjPixelSize[align];
  uVar28 = (width + tjPixelSize[align] * 0x23) - 1U & -width;
  local_13c = 0;
  local_140 = 0;
  local_134 = align;
  local_124 = align;
  iVar17 = strcasecmp(ext,"ppm");
  pcVar22 = "51976530acf75f02beddf5d21149101d";
  if (iVar17 == 0) {
    pcVar22 = "112c682e82ce5de1cca089e20d60000b";
  }
  local_108 = "6d659071b9bfcdee2def22cb58ddadca";
  if (iVar17 == 0) {
    local_108 = "c0c9f772b464d1896326883a5c79c545";
  }
  if (align == 6) {
    local_108 = pcVar22;
  }
  local_138 = uVar28;
  puVar19 = (uchar *)tjAlloc(uVar28 * 0x27);
  if (puVar19 == (uchar *)0x0) {
    pcVar26 = "ERROR: %s\n";
    pcVar22 = "Could not allocate memory";
LAB_00104232:
    iVar31 = 0;
    printf(pcVar26,pcVar22);
    exitStatus = -1;
    buf = (uchar *)0x0;
  }
  else {
    local_118 = width + -1;
    local_e0 = (long)tjRedOffset[align];
    local_e8 = (long)tjGreenOffset[align];
    local_f0 = (long)tjBlueOffset[align];
    uVar23 = 0;
    local_128 = -width;
    local_120 = (ulong)(uint)width;
    local_114 = height;
    local_110 = ext;
    local_100 = puVar19;
    do {
      uVar20 = (ulong)(0x26 - (int)uVar23);
      if ((local_114 & 2) == 0) {
        uVar20 = uVar23;
      }
      uVar25 = (ulong)(uint)((int)uVar23 << 8) * 0xd20d20d3;
      uVar28 = (uint)(uVar25 >> 0x20);
      local_88 = (double)(uVar28 >> 5 & 0xff) / -255.0 + 1.0;
      puVar19 = local_100 + (int)((int)uVar20 * local_138);
      lVar30 = 0;
      uStack_80 = 0;
      local_f8 = uVar23;
      do {
        uVar24 = ((uint)lVar30 & 0xffff) / 0x23;
        uVar29 = uVar24 + (uVar28 >> 5);
        memset(puVar19,0,local_130);
        buf = local_100;
        pcVar22 = local_110;
        height_00 = local_114;
        uVar27 = (uchar)uVar29;
        if (local_134 == 0xb) {
          dVar32 = 1.0 - (double)(uVar24 & 0xff) / 255.0;
          dVar47 = 1.0 - (double)(uVar29 & 0xff) / 255.0;
          uVar34 = SUB81(dVar32,0);
          uVar35 = (undefined1)((ulong)dVar32 >> 8);
          uVar36 = (undefined1)((ulong)dVar32 >> 0x10);
          uVar37 = (undefined1)((ulong)dVar32 >> 0x18);
          uVar38 = (undefined1)((ulong)dVar32 >> 0x20);
          uVar39 = (undefined1)((ulong)dVar32 >> 0x28);
          uVar40 = (undefined1)((ulong)dVar32 >> 0x30);
          uVar42 = (undefined1)((ulong)dVar32 >> 0x38);
          if (local_88 <= dVar32) {
            uVar34 = SUB81(local_88,0);
            uVar35 = (undefined1)((ulong)local_88 >> 8);
            uVar36 = (undefined1)((ulong)local_88 >> 0x10);
            uVar37 = (undefined1)((ulong)local_88 >> 0x18);
            uVar38 = (undefined1)((ulong)local_88 >> 0x20);
            uVar39 = (undefined1)((ulong)local_88 >> 0x28);
            uVar40 = (undefined1)((ulong)local_88 >> 0x30);
            uVar42 = (undefined1)((ulong)local_88 >> 0x38);
          }
          if (dVar47 <= (double)CONCAT17(uVar42,CONCAT16(uVar40,CONCAT15(uVar39,CONCAT14(uVar38,
                                                  CONCAT13(uVar37,CONCAT12(uVar36,CONCAT11(uVar35,
                                                  uVar34)))))))) {
            uVar34 = SUB81(dVar47,0);
            uVar35 = (undefined1)((ulong)dVar47 >> 8);
            uVar36 = (undefined1)((ulong)dVar47 >> 0x10);
            uVar37 = (undefined1)((ulong)dVar47 >> 0x18);
            uVar38 = (undefined1)((ulong)dVar47 >> 0x20);
            uVar39 = (undefined1)((ulong)dVar47 >> 0x28);
            uVar40 = (undefined1)((ulong)dVar47 >> 0x30);
            uVar42 = (undefined1)((ulong)dVar47 >> 0x38);
          }
          bVar1 = NAN((double)CONCAT17(uVar42,CONCAT16(uVar40,CONCAT15(uVar39,CONCAT14(uVar38,
                                                  CONCAT13(uVar37,CONCAT12(uVar36,CONCAT11(uVar35,
                                                  uVar34))))))));
          if ((!bVar1 && (double)CONCAT17(uVar42,CONCAT16(uVar40,CONCAT15(uVar39,CONCAT14(uVar38,
                                                  CONCAT13(uVar37,CONCAT12(uVar36,CONCAT11(uVar35,
                                                  uVar34))))))) != 1.0) || (bVar1)) {
            dVar48 = 1.0 - (double)CONCAT17(uVar42,CONCAT16(uVar40,CONCAT15(uVar39,CONCAT14(uVar38,
                                                  CONCAT13(uVar37,CONCAT12(uVar36,CONCAT11(uVar35,
                                                  uVar34)))))));
            dVar32 = (dVar32 - (double)CONCAT17(uVar42,CONCAT16(uVar40,CONCAT15(uVar39,CONCAT14(
                                                  uVar38,CONCAT13(uVar37,CONCAT12(uVar36,CONCAT11(
                                                  uVar35,uVar34)))))))) / dVar48;
            auVar45._0_8_ =
                 local_88 -
                 (double)CONCAT17(uVar42,CONCAT16(uVar40,CONCAT15(uVar39,CONCAT14(uVar38,CONCAT13(
                                                  uVar37,CONCAT12(uVar36,CONCAT11(uVar35,uVar34)))))
                                                 ));
            auVar45._8_8_ =
                 dVar47 - (double)CONCAT17(uVar42,CONCAT16(uVar40,CONCAT15(uVar39,CONCAT14(uVar38,
                                                  CONCAT13(uVar37,CONCAT12(uVar36,CONCAT11(uVar35,
                                                  uVar34)))))));
            auVar46._8_8_ = dVar48;
            auVar46._0_8_ = dVar48;
            auVar46 = divpd(auVar45,auVar46);
          }
          else {
            auVar46 = ZEXT816(0);
            dVar32 = 0.0;
          }
          iVar31 = (int)((255.0 - auVar46._8_8_ * 255.0) + 0.5);
          iVar33 = (int)((255.0 - (double)CONCAT17(uVar42,CONCAT16(uVar40,CONCAT15(uVar39,CONCAT14(
                                                  uVar38,CONCAT13(uVar37,CONCAT12(uVar36,CONCAT11(
                                                  uVar35,uVar34))))))) * 255.0) + 0.5);
          iVar17 = (int)((255.0 - dVar32 * 255.0) + 0.5);
          iVar18 = (int)((255.0 - auVar46._0_8_ * 255.0) + 0.5);
          cVar41 = (char)((uint)iVar18 >> 0x10);
          cVar43 = (char)((uint)iVar31 >> 0x10);
          cVar44 = (char)((uint)iVar33 >> 0x10);
          uVar11 = CONCAT15((char)((uint)iVar18 >> 8),CONCAT14((char)iVar18,iVar17));
          uVar21 = CONCAT17((char)((uint)iVar18 >> 0x18),CONCAT16(cVar41,uVar11));
          Var12 = CONCAT19((char)((uint)iVar31 >> 8),CONCAT18((char)iVar31,uVar21));
          auVar13[10] = cVar43;
          auVar13._0_10_ = Var12;
          auVar13[0xb] = (char)((uint)iVar31 >> 0x18);
          auVar14[0xc] = (char)iVar33;
          auVar14._0_12_ = auVar13;
          auVar14[0xd] = (char)((uint)iVar33 >> 8);
          auVar10[0xe] = cVar44;
          auVar10._0_14_ = auVar14;
          auVar10[0xf] = (char)((uint)iVar33 >> 0x18);
          sVar6 = (short)iVar17;
          cVar2 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar17 - (0xff < sVar6);
          sVar6 = (short)((uint)iVar17 >> 0x10);
          sVar7 = (short)((uint6)uVar11 >> 0x20);
          cVar3 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar18 - (0xff < sVar7);
          sVar7 = (short)((ulong)uVar21 >> 0x30);
          sVar8 = (short)((unkuint10)Var12 >> 0x40);
          cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar31 - (0xff < sVar8);
          sVar8 = auVar13._10_2_;
          sVar9 = auVar14._12_2_;
          cVar5 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar33 - (0xff < sVar9);
          sVar9 = auVar10._14_2_;
          sVar15 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar17 >> 0x10) -
                            (0xff < sVar6),cVar2);
          uVar16 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar41 - (0xff < sVar7),
                            CONCAT12(cVar3,sVar15));
          uVar11 = CONCAT15((0 < sVar8) * (sVar8 < 0x100) * cVar43 - (0xff < sVar8),
                            CONCAT14(cVar4,uVar16));
          sVar6 = (short)((uint)uVar16 >> 0x10);
          sVar7 = (short)((uint6)uVar11 >> 0x20);
          sVar8 = (short)(CONCAT17((0 < sVar9) * (sVar9 < 0x100) * cVar44 - (0xff < sVar9),
                                   CONCAT16(cVar5,uVar11)) >> 0x30);
          *(uint *)puVar19 =
               CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                        CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                 CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                          (0 < sVar15) * (sVar15 < 0x100) * cVar2 - (0xff < sVar15))
                                ));
        }
        else if (local_134 == 6) {
          *puVar19 = uVar27;
        }
        else {
          puVar19[local_e0] = (uchar)uVar24;
          puVar19[local_e8] = (uchar)(uVar25 >> 0x25);
          puVar19[local_f0] = uVar27;
        }
        lVar30 = lVar30 + 0x100;
        puVar19 = puVar19 + local_130;
      } while (lVar30 != 0x2300);
      uVar28 = (int)local_f8 + 1;
      uVar23 = (ulong)uVar28;
    } while (uVar28 != 0x27);
    pcVar26 = "bu";
    if ((local_114 & 2) == 0) {
      pcVar26 = "td";
    }
    snprintf(local_d8,0x50,"test_bmp_%s_%d_%s.%s",pixFormatStr[align],local_120,pcVar26,local_110);
    uVar28 = height_00;
    iVar17 = tjSaveImage(local_d8,buf,0x23,local_138,0x27,local_134);
    if (iVar17 == -1) {
      uVar21 = tjGetErrorStr();
      printf("TurboJPEG ERROR:\n%s\n",uVar21);
    }
    else {
      __s1 = MD5File(local_d8,local_78);
      pcVar26 = local_108;
      iVar17 = strcasecmp(__s1,local_108);
      if (iVar17 == 0) {
        tjFree(buf);
        uVar24 = height_00;
        buf = (uchar *)tjLoadImage(local_d8,&local_13c,local_120,&local_140);
        if (buf == (uchar *)0x0) goto LAB_0010449e;
        if ((local_13c == 0x23) && (local_140 == 0x27)) {
          iVar17 = cmpBitmap(buf,local_138,align,height_00,0,uVar24,uVar28);
          if (iVar17 != 0) {
            uVar23 = local_120;
            if (align == 6) {
              tjFree(buf);
              uVar23 = local_120;
              uVar24 = height_00;
              buf = (uchar *)tjLoadImage(local_d8,&local_13c,local_120 & 0xffffffff,&local_140);
              iVar17 = local_118;
              if (buf != (uchar *)0x0) {
                iVar18 = cmpBitmap(buf,local_118 + 0x8cU & local_128,4,height_00,1,uVar24,uVar28);
                if (iVar18 == 0) {
                  pcVar22 = "\n   Converting %s to RGB failed\n";
                }
                else {
                  tjFree(buf);
                  uVar24 = height_00;
                  buf = (uchar *)tjLoadImage(local_d8,&local_13c,uVar23 & 0xffffffff,&local_140);
                  if (buf == (uchar *)0x0) goto LAB_0010449e;
                  iVar17 = cmpBitmap(buf,iVar17 + 0x8cU & local_128,0xb,height_00,1,uVar24,uVar28);
                  if (iVar17 != 0) goto LAB_00104422;
                  pcVar22 = "\n   Converting %s to CMYK failed\n";
                }
                goto LAB_00104403;
              }
            }
            else {
LAB_00104422:
              tjFree(buf);
              iVar17 = local_134;
              local_124 = -1;
              buf = (uchar *)tjLoadImage(local_d8,&local_13c,uVar23 & 0xffffffff,&local_140,
                                         &local_124,height_00);
              iVar18 = local_124;
              if (buf != (uchar *)0x0) {
                lVar30 = (long)local_124;
                if ((iVar17 == 6 && local_124 != 6) ||
                   ((iVar31 = 0, iVar17 != 6 &&
                    ((iVar17 = strcasecmp(pcVar22,"bmp"), iVar17 == 0 && iVar18 != 1 ||
                     (iVar17 = strcasecmp(pcVar22,"ppm"), iVar18 != 0 && iVar17 == 0)))))) {
                  printf("\n   tjLoadImage() returned unexpected pixel format: %s\n",
                         pixFormatStr[lVar30]);
                  iVar31 = -1;
                }
                unlink(local_d8);
                goto LAB_00104268;
              }
            }
LAB_0010449e:
            pcVar22 = (char *)tjGetErrorStr();
            pcVar26 = "TurboJPEG ERROR:\n%s\n";
            goto LAB_00104232;
          }
          pcVar22 = "\n   Pixel data in %s is bogus\n";
        }
        else {
          pcVar22 = "\n   Image dimensions of %s are bogus\n";
        }
LAB_00104403:
        printf(pcVar22,local_d8);
        iVar31 = -1;
        goto LAB_00104268;
      }
      printf("\n%s has an MD5 sum of %s.\n   Should be %s.\n",local_d8,__s1,pcVar26);
    }
    iVar31 = 0;
    exitStatus = -1;
  }
LAB_00104268:
  tjFree(buf);
  if (exitStatus < 0) {
    iVar31 = exitStatus;
  }
  return iVar31;
}

Assistant:

static int doBmpTest(const char *ext, int width, int align, int height, int pf,
                     int flags)
{
  char filename[80], *md5sum, md5buf[65];
  int ps = tjPixelSize[pf], pitch = PAD(width * ps, align), loadWidth = 0,
    loadHeight = 0, retval = 0, pixelFormat = pf;
  unsigned char *buf = NULL;
  char *md5ref;

  if (pf == TJPF_GRAY) {
    md5ref = !strcasecmp(ext, "ppm") ? "112c682e82ce5de1cca089e20d60000b" :
                                       "51976530acf75f02beddf5d21149101d";
  } else {
    md5ref = !strcasecmp(ext, "ppm") ? "c0c9f772b464d1896326883a5c79c545" :
                                       "6d659071b9bfcdee2def22cb58ddadca";
  }

  if ((buf = (unsigned char *)tjAlloc(pitch * height)) == NULL)
    THROW("Could not allocate memory");
  initBitmap(buf, width, pitch, height, pf, flags);

  snprintf(filename, 80, "test_bmp_%s_%d_%s.%s", pixFormatStr[pf], align,
           (flags & TJFLAG_BOTTOMUP) ? "bu" : "td", ext);
  TRY_TJ(tjSaveImage(filename, buf, width, pitch, height, pf, flags));
  md5sum = MD5File(filename, md5buf);
  if (strcasecmp(md5sum, md5ref))
    THROW_MD5(filename, md5sum, md5ref);

  tjFree(buf);  buf = NULL;
  if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight, &pf,
                         flags)) == NULL)
    THROW_TJ();
  if (width != loadWidth || height != loadHeight) {
    printf("\n   Image dimensions of %s are bogus\n", filename);
    retval = -1;  goto bailout;
  }
  if (!cmpBitmap(buf, width, pitch, height, pf, flags, 0)) {
    printf("\n   Pixel data in %s is bogus\n", filename);
    retval = -1;  goto bailout;
  }
  if (pf == TJPF_GRAY) {
    tjFree(buf);  buf = NULL;
    pf = TJPF_XBGR;
    if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight, &pf,
                           flags)) == NULL)
      THROW_TJ();
    pitch = PAD(width * tjPixelSize[pf], align);
    if (!cmpBitmap(buf, width, pitch, height, pf, flags, 1)) {
      printf("\n   Converting %s to RGB failed\n", filename);
      retval = -1;  goto bailout;
    }

    tjFree(buf);  buf = NULL;
    pf = TJPF_CMYK;
    if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight, &pf,
                           flags)) == NULL)
      THROW_TJ();
    pitch = PAD(width * tjPixelSize[pf], align);
    if (!cmpBitmap(buf, width, pitch, height, pf, flags, 1)) {
      printf("\n   Converting %s to CMYK failed\n", filename);
      retval = -1;  goto bailout;
    }
  }
  /* Verify that tjLoadImage() returns the proper "preferred" pixel format for
     the file type. */
  tjFree(buf);  buf = NULL;
  pf = pixelFormat;
  pixelFormat = TJPF_UNKNOWN;
  if ((buf = tjLoadImage(filename, &loadWidth, align, &loadHeight,
                         &pixelFormat, flags)) == NULL)
    THROW_TJ();
  if ((pf == TJPF_GRAY && pixelFormat != TJPF_GRAY) ||
      (pf != TJPF_GRAY && !strcasecmp(ext, "bmp") &&
       pixelFormat != TJPF_BGR) ||
      (pf != TJPF_GRAY && !strcasecmp(ext, "ppm") &&
       pixelFormat != TJPF_RGB)) {
    printf("\n   tjLoadImage() returned unexpected pixel format: %s\n",
           pixFormatStr[pixelFormat]);
    retval = -1;
  }
  unlink(filename);

bailout:
  tjFree(buf);
  if (exitStatus < 0) return exitStatus;
  return retval;
}